

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  U32 UVar3;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  seqStore_t *psVar7;
  uint uVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  BYTE *pBVar13;
  seqDef *psVar14;
  uint uVar15;
  BYTE *mEnd;
  BYTE *pBVar16;
  U32 UVar17;
  int *piVar18;
  char *pcVar19;
  uint uVar20;
  int *piVar21;
  ulong uVar22;
  ulong uVar23;
  BYTE *litEnd;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  size_t ofbCandidate;
  BYTE *litLimit_w;
  U32 maxDistance;
  size_t local_f0;
  ZSTD_matchState_t *local_e8;
  int *local_e0;
  ulong local_d8;
  BYTE *local_d0;
  int *local_c8;
  uint local_bc;
  int local_b8;
  uint local_b4;
  BYTE *local_b0;
  int *local_a8;
  BYTE *local_a0;
  int *local_98;
  BYTE *local_90;
  ulong local_88;
  ulong local_80;
  U32 *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  BYTE *local_58;
  seqStore_t *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  iEnd = (BYTE *)((long)src + srcSize);
  local_c8 = (int *)((long)src + (srcSize - 8));
  local_d0 = (ms->window).base;
  local_a0 = (ms->window).dictBase;
  uVar15 = (ms->window).dictLimit;
  local_d8 = (ulong)uVar15;
  local_b0 = local_d0 + local_d8;
  uVar8 = (ms->window).lowLimit;
  uVar2 = (ms->cParams).windowLog;
  uVar25 = (ms->cParams).minMatch;
  uVar20 = 6;
  if (uVar25 < 6) {
    uVar20 = uVar25;
  }
  local_b4 = 4;
  if (4 < uVar20) {
    local_b4 = uVar20;
  }
  uVar11 = (ulong)*rep;
  uVar25 = rep[1];
  uVar12 = (ulong)uVar25;
  ms->lazySkipping = 0;
  piVar18 = (int *)((ulong)(local_b0 == (BYTE *)src) + (long)src);
  local_a8 = (int *)src;
  local_78 = rep;
  if (piVar18 < local_c8) {
    local_90 = local_a0 + local_d8;
    local_58 = local_a0 + uVar8;
    uVar8 = 1 << ((byte)uVar2 & 0x1f);
    local_88 = (ulong)uVar8;
    local_b8 = uVar15 - 1;
    local_98 = (int *)(iEnd + -0x20);
    iVar9 = (int)local_d0;
    local_68 = (ulong)(1 - (uVar8 + iVar9));
    local_60 = (ulong)(1 - iVar9);
    local_70 = (ulong)((uVar15 + iVar9) - 2);
    local_e8 = ms;
    local_a8 = (int *)src;
    local_50 = seqStore;
    do {
      pBVar16 = local_d0;
      iVar9 = ((int)piVar18 - (int)local_d0) + 1;
      UVar3 = (ms->window).lowLimit;
      UVar17 = iVar9 - (uint)local_88;
      if (iVar9 - UVar3 <= (uint)local_88) {
        UVar17 = UVar3;
      }
      if (ms->loadedDictEnd != 0) {
        UVar17 = UVar3;
      }
      uVar15 = iVar9 - (uint)uVar11;
      pBVar13 = local_d0;
      if (uVar15 < (uint)local_d8) {
        pBVar13 = local_a0;
      }
      local_e0 = piVar18;
      local_80 = uVar11;
      if (local_b8 - uVar15 < 3) {
LAB_018c9bd7:
        uVar23 = 0;
      }
      else {
        uVar23 = 0;
        if ((uint)uVar11 <= iVar9 - UVar17) {
          if (*(int *)((long)piVar18 + 1) != *(int *)(pBVar13 + uVar15)) goto LAB_018c9bd7;
          mEnd = iEnd;
          if (uVar15 < (uint)local_d8) {
            mEnd = local_90;
          }
          sVar10 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar18 + 5),(BYTE *)((long)(pBVar13 + uVar15) + 4),
                              iEnd,mEnd,local_b0);
          uVar23 = sVar10 + 4;
        }
      }
      local_f0 = 999999999;
      if (local_b4 == 6) {
        uVar11 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)local_e0,iEnd,&local_f0);
      }
      else if (local_b4 == 5) {
        uVar11 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)local_e0,iEnd,&local_f0);
      }
      else {
        uVar11 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)local_e0,iEnd,&local_f0);
      }
      uVar24 = uVar23;
      if (uVar23 < uVar11) {
        uVar24 = uVar11;
      }
      if (uVar24 < 4) {
        local_e8->lazySkipping = (uint)(0x8ff < (ulong)((long)local_e0 - (long)local_a8));
        uVar11 = local_80;
        piVar21 = local_a8;
        piVar18 = (int *)((long)local_e0 + ((ulong)((long)local_e0 - (long)local_a8) >> 8) + 1);
        ms = local_e8;
      }
      else {
        piVar21 = local_e0;
        uVar22 = local_f0;
        if (uVar11 <= uVar23) {
          piVar21 = (int *)((long)piVar18 + 1);
          uVar22 = 1;
        }
        local_bc = (uint)uVar12;
        if (local_e0 < local_c8) {
          iVar9 = (int)local_e0;
          local_38 = (ulong)(uint)((int)local_68 + iVar9);
          uVar15 = (int)local_60 + iVar9;
          local_40 = (ulong)uVar15;
          uVar8 = ((int)local_70 + (int)local_80) - iVar9;
          local_48 = (ulong)(uVar15 - (int)local_80);
          lVar26 = 0;
          do {
            piVar18 = (int *)((long)local_e0 + lVar26 + 1);
            if (uVar22 == 0) {
              uVar22 = 0;
            }
            else {
              UVar3 = (local_e8->window).lowLimit;
              iVar5 = (int)lVar26;
              iVar9 = (int)local_40 + iVar5;
              UVar17 = (int)local_38 + iVar5;
              if (iVar9 - UVar3 <= (uint)local_88) {
                UVar17 = UVar3;
              }
              if (local_e8->loadedDictEnd != 0) {
                UVar17 = UVar3;
              }
              uVar15 = (int)local_48 + iVar5;
              pBVar16 = local_d0;
              if (uVar15 < (uint)local_d8) {
                pBVar16 = local_a0;
              }
              if (((2 < uVar8) && ((uint)local_80 <= iVar9 - UVar17)) &&
                 (*piVar18 == *(int *)(pBVar16 + uVar15))) {
                pBVar13 = iEnd;
                if (uVar15 < (uint)local_d8) {
                  pBVar13 = local_90;
                }
                sVar10 = ZSTD_count_2segments
                                   ((BYTE *)((long)local_e0 + lVar26 + 5),
                                    (BYTE *)((long)(pBVar16 + uVar15) + 4),iEnd,pBVar13,local_b0);
                if (sVar10 < 0xfffffffffffffffc) {
                  uVar15 = 0x1f;
                  if ((uint)uVar22 != 0) {
                    for (; (uint)uVar22 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                    }
                  }
                  if ((int)((uVar15 ^ 0x1f) + (int)uVar24 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
                    uVar22 = 1;
                    piVar21 = piVar18;
                    uVar24 = sVar10 + 4;
                  }
                }
              }
            }
            local_f0 = 999999999;
            if (local_b4 == 6) {
              uVar12 = ZSTD_HcFindBestMatch_extDict_6(local_e8,(BYTE *)piVar18,iEnd,&local_f0);
            }
            else if (local_b4 == 5) {
              uVar12 = ZSTD_HcFindBestMatch_extDict_5(local_e8,(BYTE *)piVar18,iEnd,&local_f0);
            }
            else {
              uVar12 = ZSTD_HcFindBestMatch_extDict_4(local_e8,(BYTE *)piVar18,iEnd,&local_f0);
            }
            pBVar16 = local_d0;
            if (uVar12 < 4) goto LAB_018c9e99;
            uVar15 = 0x1f;
            if ((uint)uVar22 != 0) {
              for (; (uint)uVar22 >> uVar15 == 0; uVar15 = uVar15 - 1) {
              }
            }
            iVar9 = 0x1f;
            if ((uint)local_f0 != 0) {
              for (; (uint)local_f0 >> iVar9 == 0; iVar9 = iVar9 + -1) {
              }
            }
            if ((int)uVar12 * 4 - iVar9 <= (int)((uVar15 ^ 0x1f) + (int)uVar24 * 4 + -0x1b))
            goto LAB_018c9e99;
            lVar6 = lVar26 + 1;
            lVar26 = lVar26 + 1;
            uVar8 = uVar8 - 1;
            uVar22 = local_f0;
            piVar21 = piVar18;
            uVar24 = uVar12;
          } while ((int *)((long)local_e0 + lVar6) < local_c8);
          piVar21 = (int *)((long)local_e0 + lVar26);
        }
LAB_018c9e99:
        psVar7 = local_50;
        uVar11 = local_80;
        if (3 < uVar22) {
          pcVar19 = (char *)((long)piVar21 + (3 - (long)(pBVar16 + uVar22)));
          pBVar13 = local_b0;
          if ((uint)pcVar19 < (uint)local_d8) {
            pBVar13 = local_58;
            pBVar16 = local_a0;
          }
          if ((local_a8 < piVar21) &&
             (uVar12 = (ulong)pcVar19 & 0xffffffff, pBVar13 < pBVar16 + uVar12)) {
            pBVar16 = pBVar16 + uVar12;
            do {
              piVar18 = (int *)((long)piVar21 + -1);
              pBVar16 = pBVar16 + -1;
              if ((*(BYTE *)piVar18 != *pBVar16) ||
                 (uVar24 = uVar24 + 1, piVar21 = piVar18, piVar18 <= local_a8)) break;
            } while (pBVar13 < pBVar16);
          }
          local_bc = (uint)local_80;
          uVar11 = (ulong)((U32)uVar22 - 3);
        }
        uVar12 = (long)piVar21 - (long)local_a8;
        pBVar16 = local_50->lit;
        if (local_98 < piVar21) {
          ZSTD_safecopyLiterals(pBVar16,(BYTE *)local_a8,(BYTE *)piVar21,(BYTE *)local_98);
LAB_018c9f54:
          psVar7->lit = psVar7->lit + uVar12;
          psVar14 = psVar7->sequences;
          if (0xffff < uVar12) {
            psVar7->longLengthType = ZSTD_llt_literalLength;
            psVar7->longLengthPos =
                 (U32)((ulong)((long)psVar14 - (long)psVar7->sequencesStart) >> 3);
          }
        }
        else {
          uVar4 = *(undefined8 *)(local_a8 + 2);
          *(undefined8 *)pBVar16 = *(undefined8 *)local_a8;
          *(undefined8 *)(pBVar16 + 8) = uVar4;
          pBVar16 = local_50->lit;
          if (0x10 < uVar12) {
            uVar4 = *(undefined8 *)(local_a8 + 6);
            *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)(local_a8 + 4);
            *(undefined8 *)(pBVar16 + 0x18) = uVar4;
            if (0x20 < (long)uVar12) {
              lVar26 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_a8 + lVar26 + 0x20);
                uVar4 = puVar1[1];
                pBVar13 = pBVar16 + lVar26 + 0x20;
                *(undefined8 *)pBVar13 = *puVar1;
                *(undefined8 *)(pBVar13 + 8) = uVar4;
                puVar1 = (undefined8 *)((long)local_a8 + lVar26 + 0x30);
                uVar4 = puVar1[1];
                *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar13 + 0x18) = uVar4;
                lVar26 = lVar26 + 0x20;
              } while (pBVar13 + 0x20 < pBVar16 + uVar12);
            }
            goto LAB_018c9f54;
          }
          local_50->lit = pBVar16 + uVar12;
          psVar14 = local_50->sequences;
        }
        ms = local_e8;
        psVar14->litLength = (U16)uVar12;
        psVar14->offBase = (U32)uVar22;
        if (0xffff < uVar24 - 3) {
          psVar7->longLengthType = ZSTD_llt_matchLength;
          psVar7->longLengthPos = (U32)((ulong)((long)psVar14 - (long)psVar7->sequencesStart) >> 3);
        }
        psVar14->mlBase = (U16)(uVar24 - 3);
        psVar7->sequences = psVar14 + 1;
        uVar12 = (ulong)local_bc;
        if (local_e8->lazySkipping != 0) {
          local_e8->lazySkipping = 0;
        }
        piVar21 = (int *)((long)piVar21 + uVar24);
        piVar18 = piVar21;
        if (piVar21 <= local_c8) {
          uVar23 = uVar11 & 0xffffffff;
          do {
            uVar24 = uVar12;
            uVar11 = uVar23;
            iVar9 = (int)piVar21 - (int)local_d0;
            UVar3 = (ms->window).lowLimit;
            UVar17 = iVar9 - (uint)local_88;
            if (iVar9 - UVar3 <= (uint)local_88) {
              UVar17 = UVar3;
            }
            if (ms->loadedDictEnd != 0) {
              UVar17 = UVar3;
            }
            uVar15 = iVar9 - (uint)uVar24;
            pBVar16 = local_d0;
            if (uVar15 < (uint)local_d8) {
              pBVar16 = local_a0;
            }
            piVar18 = piVar21;
            uVar12 = uVar24;
            if (((local_b8 - uVar15 < 3) || (iVar9 - UVar17 < (uint)uVar24)) ||
               (*piVar21 != *(int *)(pBVar16 + uVar15))) break;
            pBVar13 = iEnd;
            if (uVar15 < (uint)local_d8) {
              pBVar13 = local_90;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)(piVar21 + 1),(BYTE *)((long)(pBVar16 + uVar15) + 4),iEnd,
                                pBVar13,local_b0);
            pBVar16 = psVar7->lit;
            if (local_98 < piVar21) {
              ZSTD_safecopyLiterals(pBVar16,(BYTE *)piVar21,(BYTE *)piVar21,(BYTE *)local_98);
            }
            else {
              uVar4 = *(undefined8 *)(piVar21 + 2);
              *(undefined8 *)pBVar16 = *(undefined8 *)piVar21;
              *(undefined8 *)(pBVar16 + 8) = uVar4;
            }
            psVar14 = psVar7->sequences;
            psVar14->litLength = 0;
            psVar14->offBase = 1;
            if (0xffff < sVar10 + 1) {
              psVar7->longLengthType = ZSTD_llt_matchLength;
              psVar7->longLengthPos =
                   (U32)((ulong)((long)psVar14 - (long)psVar7->sequencesStart) >> 3);
            }
            psVar14->mlBase = (U16)(sVar10 + 1);
            psVar7->sequences = psVar14 + 1;
            piVar21 = (int *)((long)piVar21 + sVar10 + 4);
            uVar23 = uVar24;
            uVar12 = uVar11;
            uVar11 = uVar24;
            piVar18 = piVar21;
          } while (piVar21 <= local_c8);
        }
      }
      uVar25 = (uint)uVar12;
      local_a8 = piVar21;
    } while (piVar18 < local_c8);
  }
  *local_78 = (U32)uVar11;
  local_78[1] = uVar25;
  return (long)iEnd - (long)local_a8;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1);
}